

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncGeneratorThrowFunction(JavascriptLibrary *this)

{
  JavascriptFunction **ppJVar1;
  RuntimeFunction *ptr;
  JavascriptLibrary *this_local;
  
  ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->asyncGeneratorThrowFunction);
  if (*ppJVar1 == (JavascriptFunction *)0x0) {
    ptr = DefaultCreateFunction
                    (this,(FunctionInfo *)JavascriptAsyncGenerator::EntryInfo::Throw,1,
                     (DynamicObject *)0x0,(DynamicType *)0x0,0x16a);
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
              (&this->asyncGeneratorThrowFunction,&ptr->super_JavascriptFunction);
  }
  ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->asyncGeneratorThrowFunction);
  return *ppJVar1;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureAsyncGeneratorThrowFunction()
    {
        if (asyncGeneratorThrowFunction == nullptr)
        {
            asyncGeneratorThrowFunction = DefaultCreateFunction(&JavascriptAsyncGenerator::EntryInfo::Throw, 1, nullptr, nullptr, PropertyIds::throw_);
        }
        return asyncGeneratorThrowFunction;
    }